

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O2

AC_STATUS_t ac_trie_add(AC_TRIE_t *thiz,AC_PATTERN_t *patt,int copy)

{
  AC_ALPHABET_t alpha;
  AC_STATUS_t AVar1;
  ACT_NODE_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  act_node *nod;
  
  if (thiz->trie_open != 0) {
    uVar3 = (patt->ptext).length;
    if (uVar3 == 0) {
      AVar1 = ACERR_ZERO_PATTERN;
    }
    else if (uVar3 < 0x401) {
      nod = thiz->root;
      for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
        alpha = (patt->ptext).astring[uVar4];
        pAVar2 = node_find_next(nod,alpha);
        if (pAVar2 == (ACT_NODE_t *)0x0) {
          pAVar2 = node_create_next(nod,alpha);
          pAVar2->depth = nod->depth + 1;
        }
        uVar3 = (patt->ptext).length;
        nod = pAVar2;
      }
      if (nod->final == 0) {
        nod->final = 1;
        node_accept_pattern(nod,patt,copy);
        thiz->patterns_count = thiz->patterns_count + 1;
        AVar1 = ACERR_SUCCESS;
      }
      else {
        AVar1 = ACERR_DUPLICATE_PATTERN;
      }
    }
    else {
      AVar1 = ACERR_LONG_PATTERN;
    }
    return AVar1;
  }
  return ACERR_TRIE_CLOSED;
}

Assistant:

AC_STATUS_t ac_trie_add (AC_TRIE_t *thiz, AC_PATTERN_t *patt, int copy)
{
    size_t i;
    ACT_NODE_t *n = thiz->root;
    ACT_NODE_t *next;
    AC_ALPHABET_t alpha;
    
    if(!thiz->trie_open)
        return ACERR_TRIE_CLOSED;
    
    if (!patt->ptext.length)
        return ACERR_ZERO_PATTERN;
    
    if (patt->ptext.length > AC_PATTRN_MAX_LENGTH)
        return ACERR_LONG_PATTERN;
    
    for (i = 0; i < patt->ptext.length; i++)
    {
        alpha = patt->ptext.astring[i];
        if ((next = node_find_next (n, alpha)))
        {
            n = next;
            continue;
        }
        else
        {
            next = node_create_next (n, alpha);
            next->depth = n->depth + 1;
            n = next;
        }
    }
    
    if(n->final)
        return ACERR_DUPLICATE_PATTERN;
    
    n->final = 1;
    node_accept_pattern (n, patt, copy);
    thiz->patterns_count++;
    
    return ACERR_SUCCESS;
}